

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall t_rs_generator::render_type_comment(t_rs_generator *this,string *type_name)

{
  ostream *poVar1;
  ofstream_with_content_based_conditional_update *poVar2;
  
  poVar2 = &this->f_gen_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"//",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar2,(type_name->_M_dataplus)._M_p,type_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"//",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  return;
}

Assistant:

void t_rs_generator::render_type_comment(const string& type_name) {
  f_gen_ << "//" << endl;
  f_gen_ << "// " << type_name << endl;
  f_gen_ << "//" << endl;
  f_gen_ << endl;
}